

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O2

int jpc_dec_tilefini(jpc_dec_t *dec,jpc_dec_tile_t *tile)

{
  jpc_dec_seg_t *seg;
  uint uVar1;
  int iVar2;
  int iVar3;
  jpc_dec_band_t *pjVar4;
  int iVar5;
  jpc_dec_cblk_t *pjVar6;
  int iVar7;
  jpc_dec_prc_t *pjVar8;
  jpc_dec_tcomp_t *local_60;
  jpc_dec_rlvl_t *local_58;
  
  local_60 = tile->tcomps;
  if (local_60 != (jpc_dec_tcomp_t *)0x0) {
    for (iVar2 = 0; iVar2 < dec->numcomps; iVar2 = iVar2 + 1) {
      local_58 = local_60->rlvls;
      for (uVar1 = 0; uVar1 < local_60->numrlvls; uVar1 = uVar1 + 1) {
        pjVar4 = local_58->bands;
        if (pjVar4 != (jpc_dec_band_t *)0x0) {
          for (iVar5 = 0; iVar5 < local_58->numbands; iVar5 = iVar5 + 1) {
            pjVar8 = pjVar4->prcs;
            if (pjVar8 != (jpc_dec_prc_t *)0x0) {
              for (iVar7 = 0; iVar7 < local_58->numprcs; iVar7 = iVar7 + 1) {
                pjVar6 = pjVar8->cblks;
                if (pjVar6 != (jpc_dec_cblk_t *)0x0) {
                  for (iVar3 = 0; iVar3 < pjVar8->numcblks; iVar3 = iVar3 + 1) {
                    while (seg = (pjVar6->segs).head, seg != (jpc_dec_seg_t *)0x0) {
                      jpc_seglist_remove(&pjVar6->segs,seg);
                      jpc_seg_destroy(seg);
                    }
                    jas_matrix_destroy(pjVar6->data);
                    if (pjVar6->mqdec != (jpc_mqdec_t *)0x0) {
                      jpc_mqdec_destroy(pjVar6->mqdec);
                    }
                    if (pjVar6->nulldec != (jpc_bitstream_t *)0x0) {
                      jpc_bitstream_close(pjVar6->nulldec);
                    }
                    if (pjVar6->flags != (jas_matrix_t *)0x0) {
                      jas_matrix_destroy(pjVar6->flags);
                    }
                    pjVar6 = pjVar6 + 1;
                  }
                  if (pjVar8->incltagtree != (jpc_tagtree_t *)0x0) {
                    jpc_tagtree_destroy(pjVar8->incltagtree);
                  }
                  if (pjVar8->numimsbstagtree != (jpc_tagtree_t *)0x0) {
                    jpc_tagtree_destroy(pjVar8->numimsbstagtree);
                  }
                  if (pjVar8->cblks != (jpc_dec_cblk_t *)0x0) {
                    jas_free(pjVar8->cblks);
                  }
                }
                pjVar8 = pjVar8 + 1;
              }
            }
            if (pjVar4->data != (jas_matrix_t *)0x0) {
              jas_matrix_destroy(pjVar4->data);
            }
            if (pjVar4->prcs != (jpc_dec_prc_t *)0x0) {
              jas_free(pjVar4->prcs);
            }
            pjVar4 = pjVar4 + 1;
          }
          if (local_58->bands != (jpc_dec_band_t *)0x0) {
            jas_free(local_58->bands);
          }
        }
        local_58 = local_58 + 1;
      }
      if (local_60->rlvls != (jpc_dec_rlvl_t *)0x0) {
        jas_free(local_60->rlvls);
      }
      if (local_60->data != (jas_matrix_t *)0x0) {
        jas_matrix_destroy(local_60->data);
      }
      if (local_60->tsfb != (jpc_tsfb_t *)0x0) {
        jpc_tsfb_destroy(local_60->tsfb);
      }
      local_60 = local_60 + 1;
    }
  }
  if (tile->cp != (jpc_dec_cp_t *)0x0) {
    jpc_dec_cp_destroy(tile->cp);
  }
  if (tile->tcomps != (jpc_dec_tcomp_t *)0x0) {
    jas_free(tile->tcomps);
  }
  if (tile->pi != (jpc_pi_t *)0x0) {
    jpc_pi_destroy(tile->pi);
  }
  if (tile->pkthdrstream != (jas_stream_t *)0x0) {
    jas_stream_close(tile->pkthdrstream);
  }
  if (tile->pptstab != (jpc_ppxstab_t *)0x0) {
    jpc_ppxstab_destroy(tile->pptstab);
  }
  tile->state = 3;
  return (int)tile;
}

Assistant:

static int jpc_dec_tilefini(jpc_dec_t *dec, jpc_dec_tile_t *tile)
{
	jpc_dec_tcomp_t *tcomp;
	int compno;
	int bandno;
	unsigned rlvlno;
	jpc_dec_band_t *band;
	jpc_dec_rlvl_t *rlvl;
	int prcno;
	jpc_dec_prc_t *prc;
	jpc_dec_seg_t *seg;
	jpc_dec_cblk_t *cblk;
	int cblkno;

	if (tile->tcomps) {

		for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
		  ++compno, ++tcomp) {
			for (rlvlno = 0, rlvl = tcomp->rlvls; rlvlno < tcomp->numrlvls;
			  ++rlvlno, ++rlvl) {
				if (!rlvl->bands) {
					continue;
				}
				for (bandno = 0, band = rlvl->bands; bandno < rlvl->numbands;
				  ++bandno, ++band) {
					if (band->prcs) {
						for (prcno = 0, prc = band->prcs; prcno <
						  rlvl->numprcs; ++prcno, ++prc) {
							if (!prc->cblks) {
								continue;
							}
							for (cblkno = 0, cblk = prc->cblks; cblkno <
							  prc->numcblks; ++cblkno, ++cblk) {

								while (cblk->segs.head) {
									seg = cblk->segs.head;
									jpc_seglist_remove(&cblk->segs, seg);
									jpc_seg_destroy(seg);
								}
								jas_matrix_destroy(cblk->data);
								if (cblk->mqdec) {
									jpc_mqdec_destroy(cblk->mqdec);
								}
								if (cblk->nulldec) {
									jpc_bitstream_close(cblk->nulldec);
								}
								if (cblk->flags) {
									jas_matrix_destroy(cblk->flags);
								}
							}
							if (prc->incltagtree) {
								jpc_tagtree_destroy(prc->incltagtree);
							}
							if (prc->numimsbstagtree) {
								jpc_tagtree_destroy(prc->numimsbstagtree);
							}
							if (prc->cblks) {
								jas_free(prc->cblks);
							}
						}
					}
					if (band->data) {
						jas_matrix_destroy(band->data);
					}
					if (band->prcs) {
						jas_free(band->prcs);
					}
				}
				if (rlvl->bands) {
					jas_free(rlvl->bands);
				}
			}
			if (tcomp->rlvls) {
				jas_free(tcomp->rlvls);
			}
			if (tcomp->data) {
				jas_matrix_destroy(tcomp->data);
			}
			if (tcomp->tsfb) {
				jpc_tsfb_destroy(tcomp->tsfb);
			}
		}
	}

	if (tile->cp) {
		jpc_dec_cp_destroy(tile->cp);
		//tile->cp = 0;
	}
	if (tile->tcomps) {
		jas_free(tile->tcomps);
		//tile->tcomps = 0;
	}
	if (tile->pi) {
		jpc_pi_destroy(tile->pi);
		//tile->pi = 0;
	}
	if (tile->pkthdrstream) {
		jas_stream_close(tile->pkthdrstream);
		//tile->pkthdrstream = 0;
	}
	if (tile->pptstab) {
		jpc_ppxstab_destroy(tile->pptstab);
		//tile->pptstab = 0;
	}

	tile->state = JPC_TILE_DONE;

	return 0;
}